

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::
Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  StringPtr *params;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  unsigned_long *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 func;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar3;
  ArrayPtr<kj::StringPtr> AVar4;
  undefined1 *local_f0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_e8;
  size_t local_e0;
  StringPtr **local_d8;
  StringPtr *local_d0;
  undefined1 local_c8 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  _kjDefer452;
  bool success;
  unsigned_long *existing;
  StringPtr *local_68;
  size_t local_60;
  Maybe<unsigned_long> local_58;
  undefined1 local_48 [8];
  NullableValue<unsigned_long> _existing445;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  uint skip_local;
  StringPtr *row_local;
  size_t pos_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table_local;
  Maybe<unsigned_long> *result;
  
  row_local = (StringPtr *)pos;
  pos_local = (size_t)table;
  table_local = (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
                this;
  if (skip == 0) {
    MVar3 = Impl<1UL,_true>::insert
                      ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                        *)this,(size_t)table,(StringPtr *)pos,(uint)row);
    aVar1 = MVar3.ptr.field_1;
  }
  else {
    aVar1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            get<0ul,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>&>(&table->indexes);
    _existing445.field_1 = aVar1;
    AVar4 = Vector<kj::StringPtr>::asPtr((Vector<kj::StringPtr> *)pos_local);
    params = row_local;
    TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::keyForRow<kj::StringPtr&>
              ((TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *)_existing445.field_1,row);
    local_68 = AVar4.ptr;
    local_60 = AVar4.size_;
    AVar4.size_ = (size_t)local_68;
    AVar4.ptr = (StringPtr *)aVar1.value;
    TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::insert<kj::StringPtr,kj::StringPtr>
              ((TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *)&local_58,AVar4,local_60,
               params);
    other = kj::_::readMaybe<unsigned_long>(&local_58);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_48,other);
    Maybe<unsigned_long>::~Maybe(&local_58);
    puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_48);
    if (puVar2 != (unsigned_long *)0x0) {
      t = kj::_::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_48);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,t);
    }
    _kjDefer452.maybeFunc.ptr.field_1._37_3_ = 0;
    _kjDefer452.maybeFunc.ptr.field_1._36_1_ = puVar2 != (unsigned_long *)0x0;
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_48);
    aVar1 = func;
    if (_kjDefer452.maybeFunc.ptr.field_1._36_4_ == 0) {
      _kjDefer452.maybeFunc.ptr.field_1._35_1_ = 0;
      local_f0 = (undefined1 *)((long)&_kjDefer452.maybeFunc.ptr.field_1 + 0x23);
      local_e8 = _existing445.field_1;
      local_e0 = pos_local;
      local_d8 = &row_local;
      local_d0 = row;
      defer<kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::Impl<0ul,false>::insert(kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>&,unsigned_long,kj::StringPtr&,unsigned_int)::_lambda()_1_>
                ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
                  *)local_c8,(kj *)&local_f0,(Type *)func);
      Impl<1UL,_true>::insert
                ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *
                 )this,pos_local,row_local,(uint)row);
      _kjDefer452.maybeFunc.ptr.field_1._35_1_ =
           Maybe<unsigned_long>::operator==((Maybe<unsigned_long> *)this);
      _kjDefer452.maybeFunc.ptr.field_1._36_4_ = 1;
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
                   *)local_c8);
      aVar1 = extraout_RDX;
    }
  }
  MVar3.ptr.field_1.value = aVar1.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }